

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_SHORT_BEAM(effect_handler_context_t *context)

{
  wchar_t typ;
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t dam_00;
  wchar_t wVar3;
  source origin;
  int local_4c;
  bool local_41;
  wchar_t local_38;
  uint8_t local_34;
  wchar_t flg;
  wchar_t diameter_of_source;
  loc_conflict target;
  wchar_t rad;
  _Bool add;
  wchar_t type;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  typ = context->subtype;
  local_41 = false;
  if ((context->origin).what == SRC_PLAYER) {
    local_41 = L'\0' < context->other;
  }
  target.y._3_1_ = local_41;
  wVar1 = context->radius;
  if (local_41 == false) {
    local_4c = 0;
  }
  else {
    wVar3 = eff_level(player);
    local_4c = wVar3 / context->other;
  }
  target.x = wVar1 + local_4c;
  _flg = (loc_conflict)loc(-1,-1);
  wVar1 = target.x;
  local_34 = (uint8_t)target.x;
  local_38 = L'Ѱ';
  if ((context->origin).what == SRC_MONSTER) {
    local_38 = L'౰';
    flg = (player->grid).x;
    unique0x00012004 = (player->grid).y;
  }
  else if ((context->origin).what == SRC_PLAYER) {
    if ((context->dir == L'\x05') && (_Var2 = target_okay(), _Var2)) {
      target_get((loc *)&flg);
    }
    else {
      _flg = (loc_conflict)loc_sum(player->grid,ddgrid[context->dir]);
    }
  }
  if (L'\x19' < wVar1) {
    local_34 = '\x19';
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var2 = project(origin,target.x,_flg,dam_00,typ,local_38,L'\0',local_34,context->obj);
  if (_Var2) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_SHORT_BEAM(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int type = context->subtype;
	bool add = (context->origin.what == SRC_PLAYER) && (context->other > 0);
	int rad = context->radius + (add ? eff_level(player) / context->other : 0);

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		flg |= PROJECT_PLAY;
		target = player->grid;
	} else if (context->origin.what == SRC_PLAYER) {
		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Aim at the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}